

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

void __thiscall n_e_s::core::Ppu::fetch(Ppu *this)

{
  byte bVar1;
  ushort uVar2;
  PpuRegisters *pPVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ushort uVar12;
  
  pPVar3 = this->registers_;
  uVar2 = pPVar3->cycle;
  uVar9 = uVar2 - 1;
  if ((uVar9 & 0xffff) < 0x100 || (ushort)(uVar2 - 0x141) < 0x10) {
    iVar7 = (uint)pPVar3->pattern_table_shifter_low * 2;
    pPVar3->pattern_table_shifter_low = (uint16_t)iVar7;
    iVar4 = (uint)pPVar3->pattern_table_shifter_hi * 2;
    pPVar3->pattern_table_shifter_hi = (uint16_t)iVar4;
    uVar5 = pPVar3->attribute_table_shifter_low * 2;
    pPVar3->attribute_table_shifter_low = uVar5;
    uVar6 = pPVar3->attribute_table_shifter_hi * 2;
    pPVar3->attribute_table_shifter_hi = uVar6;
    uVar10 = uVar2 + 6;
    if (-1 < (int)uVar9) {
      uVar10 = uVar9;
    }
    iVar11 = (uint)uVar2 - (uVar10 & 0xfffffff8);
    if (iVar11 - 1U < 7) {
      uVar9 = ((pPVar3->ctrl).value_ & 0x10) << 8;
      uVar2 = (pPVar3->vram_addr).super_Register<unsigned_short>.value_;
      switch(iVar11) {
      case 1:
        pPVar3->pattern_table_shifter_low =
             (uint16_t)CONCAT31((int3)((uint)iVar7 >> 8),pPVar3->pattern_table_latch_low);
        pPVar3->pattern_table_shifter_hi =
             (uint16_t)CONCAT31((int3)((uint)iVar4 >> 8),pPVar3->pattern_table_latch_hi);
        uVar8 = 0xff;
        if ((pPVar3->attribute_table_latch & 1) == 0) {
          uVar8 = 0;
        }
        uVar12 = 0xff;
        if ((pPVar3->attribute_table_latch & 2) == 0) {
          uVar12 = 0;
        }
        pPVar3->attribute_table_shifter_low = uVar8 | uVar5 & 0xff00;
        pPVar3->attribute_table_shifter_hi = uVar12 | uVar6 & 0xff00;
        pPVar3->name_table = pPVar3->name_table_latch;
        iVar7 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)(uVar2 & 0xfff | 0x2000));
        this->registers_->name_table_latch = (uint8_t)iVar7;
        break;
      case 3:
        iVar7 = (*this->mmu_->_vptr_IMmu[3])
                          (this->mmu_,
                           (ulong)((uVar2 >> 2 & 7) + (uVar2 >> 4 & 0x38 | uVar2 & 0xc00) + 0x23c0))
        ;
        bVar1 = (byte)(this->registers_->vram_addr).super_Register<unsigned_short>.value_;
        this->registers_->attribute_table_latch =
             (byte)((byte)iVar7 >> (bVar1 >> 4 & 4)) >> (bVar1 & 2) & 3;
        break;
      case 5:
        iVar7 = (*this->mmu_->_vptr_IMmu[3])
                          (this->mmu_,
                           (ulong)(uVar9 | (uint)pPVar3->name_table_latch << 4 | uVar2 >> 0xc & 7));
        this->registers_->pattern_table_latch_low = (uint8_t)iVar7;
        break;
      case 7:
        iVar7 = (*this->mmu_->_vptr_IMmu[3])
                          (this->mmu_,
                           (ulong)(uVar9 | (uint)(uVar2 >> 0xc) |
                                           (uint)pPVar3->name_table_latch << 4 | 8));
        this->registers_->pattern_table_latch_hi = (uint8_t)iVar7;
      }
    }
  }
  else if ((uVar2 | 2) == 0x153) {
    (*this->mmu_->_vptr_IMmu[3])
              (this->mmu_,
               (ulong)((pPVar3->vram_addr).super_Register<unsigned_short>.value_ & 0xfff | 0x2000));
    return;
  }
  return;
}

Assistant:

void Ppu::fetch() {
    if ((cycle() >= 1 && cycle() <= 256) ||
            (cycle() >= 321 && cycle() <= 336)) {
        shift_registers();
        const uint16_t background_pattern_table_base_address =
                registers_->ctrl.is_set(4u) ? 0x1000u : 0x0000u;
        const uint8_t fine_scroll_y = registers_->vram_addr.fine_scroll_y();

        switch ((cycle() - 1) % 8) {
        case 0: {
            registers_->pattern_table_shifter_low =
                    (registers_->pattern_table_shifter_low & 0xFF00u) |
                    registers_->pattern_table_latch_low;
            registers_->pattern_table_shifter_hi =
                    (registers_->pattern_table_shifter_hi & 0xFF00u) |
                    registers_->pattern_table_latch_hi;

            registers_->attribute_table_shifter_low =
                    (registers_->attribute_table_shifter_low & 0xFF00u) |
                    ((registers_->attribute_table_latch & 0b01u) ? 0xFFu
                                                                 : 0x00u);
            registers_->attribute_table_shifter_hi =
                    (registers_->attribute_table_shifter_hi & 0xFF00u) |
                    ((registers_->attribute_table_latch & 0b10u) ? 0xFFu
                                                                 : 0x00u);

            registers_->name_table = registers_->name_table_latch;
            const uint16_t nametable_address =
                    get_nametable_address(registers_->vram_addr.value());
            registers_->name_table_latch = mmu_->read_byte(nametable_address);
            break;
        }
        case 2: {
            const uint16_t attribute_address =
                    get_attribute_address(registers_->vram_addr.value());
            uint8_t byte = mmu_->read_byte(attribute_address);
            // Figure out which quadrant we are in and get the two corresponding
            // bits.
            // 7654 3210
            // |||| ||++- Color bits 3-2 for top left quadrant of this byte
            // |||| ++--- Color bits 3-2 for top right quadrant of this byte
            // ||++------ Color bits 3-2 for bottom left quadrant of this byte
            // ++-------- Color bits 3-2 for bottom right quadrant of this byte
            const uint8_t coarse_y = registers_->vram_addr.coarse_scroll_y();
            const uint8_t coarse_x = registers_->vram_addr.coarse_scroll_x();
            if (coarse_y % 4u >= 2u) {
                // We are in the bottom quadrant
                byte >>= 4u;
            }
            if (coarse_x % 4u >= 2u) {
                // We are in the right quadrant
                byte >>= 2u;
            }
            byte &= 0x0000'0003u;
            registers_->attribute_table_latch = byte;
            break;
        }
        case 4: {
            const uint16_t index = background_pattern_table_base_address +
                                   (registers_->name_table_latch * 16u) +
                                   fine_scroll_y;
            registers_->pattern_table_latch_low = mmu_->read_byte(index);
            break;
        }
        case 6: {
            const uint16_t index = background_pattern_table_base_address +
                                   (registers_->name_table_latch * 16u) +
                                   fine_scroll_y;
            // +8 for next bit plane
            registers_->pattern_table_latch_hi = mmu_->read_byte(index + 0x8u);
            break;
        }
        };
    } else if (cycle() == 337 || cycle() == 339) {
        // Unused fetches. Uses the same nametable address as will be fetched
        // at the beginning of the next scanline (tile 3 since tile 1 and 2
        // were fetched already in the end of this scanline).
        const uint16_t nametable_address =
                get_nametable_address(registers_->vram_addr.value());
        std::ignore = mmu_->read_byte(nametable_address);
    }
}